

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::coap::CodeToString_abi_cxx11_
          (string *__return_storage_ptr__,coap *this,Code aCode)

{
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  switch((int)this) {
  case 0x80:
    break;
  case 0x81:
    break;
  case 0x82:
    break;
  case 0x83:
    break;
  case 0x84:
    break;
  case 0x85:
    break;
  case 0x86:
    break;
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8e:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
switchD_0019ccd7_caseD_87:
    break;
  case 0x8c:
    break;
  case 0x8d:
    break;
  case 0x8f:
    break;
  case 0xa0:
    break;
  case 0xa1:
    break;
  case 0xa2:
    break;
  case 0xa3:
    break;
  case 0xa4:
    break;
  case 0xa5:
    break;
  default:
    switch((ulong)this & 0xffffffff) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    default:
      switch((int)this) {
      case 0x41:
        break;
      case 0x42:
        break;
      case 0x43:
        break;
      case 0x44:
        break;
      case 0x45:
        break;
      default:
        goto switchD_0019ccd7_caseD_87;
      }
    }
  }
  std::__cxx11::string::assign((char *)&local_28);
  std::operator+(__return_storage_ptr__,"CoAP::",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string CodeToString(Code aCode)
{
    std::string str;

    switch (aCode)
    {
    /*
     * Methods (0.XX).
     */
    case Code::kEmpty:
        str = "EMPTY";
        break;
    case Code::kGet:
        str = "GET";
        break;
    case Code::kPost:
        str = "POST";
        break;

    case Code::kPut:
        str = "PUT";
        break;

    case Code::kDelete:
        str = "DELETE";
        break;

    /*
     * Success (2.XX).
     */
    case Code::kCreated:
        str = "CREATED";
        break;
    case Code::kDeleted:
        str = "DELETED";
        break;
    case Code::kValid:
        str = "VALID";
        break;
    case Code::kChanged:
        str = "CHANGED";
        break;
    case Code::kContent:
        str = "CONTENT";
        break;

    /*
     * Client side errors (4.XX).
     */
    case Code::kBadRequest:
        str = "BAD_REQUEST";
        break;
    case Code::kUnauthorized:
        str = "UNAUTHORIZED";
        break;
    case Code::kBadOption:
        str = "BAD_OPTION";
        break;
    case Code::kForBidden:
        str = "FORBIDDEN";
        break;
    case Code::kNotFound:
        str = "NOT_FOUND";
        break;
    case Code::kMethodNotAllowed:
        str = "METHOD_NOT_ALLOWED";
        break;
    case Code::kNotAcceptable:
        str = "NOT_ACCEPTABLE";
        break;
    case Code::kPreconditionFailed:
        str = "PRECONDITIONFAILED";
        break;
    case Code::kRequestTooLarge:
        str = "REQUEST_TOOL_LARGE";
        break;
    case Code::kUnsupportedFormat:
        str = "UNSUPPORTED_FORMAT";
        break;

    /*
     * Server side errors (5.XX).
     */
    case Code::kInternalError:
        str = "INTERNAL_ERROR";
        break;
    case Code::kNotImplemented:
        str = "NOT_IMPLEMENTED";
        break;
    case Code::kBadGateway:
        str = "BAD_GATEWAY";
        break;
    case Code::kServiceUnavailable:
        str = "SERVICE_UNAVAILABLE";
        break;
    case Code::kGatewayTimeout:
        str = "BATEWAY_TIMEOUT";
        break;
    case Code::kProxyNotSupported:
        str = "PROXY_NOT_SUPPORTED";
        break;
    default:
        str = "UNKNOWN";
        break;
    }

    return "CoAP::" + str;
}